

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

bool __thiscall Preprocessor::skipBranch(Preprocessor *this)

{
  Token TVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (this->super_Parser).index;
  lVar3 = (this->super_Parser).symbols.d.size + -1;
  bVar2 = lVar4 < lVar3;
  if (lVar4 < lVar3) {
    do {
      TVar1 = (this->super_Parser).symbols.d.ptr[lVar4].token;
      if (TVar1 - PP_ELIF < 3) {
        return bVar2;
      }
      if (TVar1 - PP_IF < 3) {
        (this->super_Parser).index = lVar4 + 1;
        skipUntilEndif(this);
      }
      lVar3 = (this->super_Parser).symbols.d.size;
      lVar4 = (this->super_Parser).index + 1;
      (this->super_Parser).index = lVar4;
      lVar3 = lVar3 + -1;
      bVar2 = lVar4 < lVar3;
    } while (lVar4 < lVar3);
  }
  return bVar2;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }